

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_avgdev.c
# Opt level: O0

TA_RetCode
rangeTestFunction(TA_Integer startIdx,TA_Integer endIdx,TA_Real *outputBuffer,
                 TA_Integer *outputBufferInt,TA_Integer *outBegIdx,TA_Integer *outNbElement,
                 TA_Integer *lookback,void *opaqueData,uint outputNb,uint *isOutputInteger)

{
  int iVar1;
  void *__ptr;
  double *in_RCX;
  void *in_RDX;
  double *unaff_RBP;
  int in_ESI;
  int in_EDI;
  double *in_R8;
  double *in_R9;
  TA_MAType unaff_R12D;
  int *unaff_R14;
  int *unaff_R15;
  double *unaff_retaddr;
  double *in_stack_00000008;
  double *in_stack_00000010;
  int in_stack_00000018;
  uint in_stack_0000001c;
  undefined4 *in_stack_00000020;
  TA_Real *dummyOutput;
  TA_RangeTestParam_conflict17 *testParam;
  TA_RetCode retCode;
  TA_MAType optInFastD_MAType;
  int in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 uVar3;
  undefined8 uVar2;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar5;
  undefined8 uVar4;
  void *pvVar6;
  double *pdVar7;
  undefined4 in_stack_ffffffffffffffa8;
  TA_RetCode optInFastK_Period;
  int endIdx_00;
  int iVar8;
  TA_MAType TVar9;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  *in_stack_00000020 = 0;
  optInFastK_Period = TA_NOT_SUPPORTED;
  pdVar7 = in_stack_00000010;
  __ptr = malloc((long)(in_ESI - in_EDI) * 8 + 8);
  iVar1 = *(int *)*pdVar7;
  iVar8 = (int)((ulong)in_RDX >> 0x20);
  TVar9 = (TA_MAType)unaff_R14;
  if (iVar1 == 0) {
    if (in_stack_00000018 == 0) {
      iVar1 = *(int *)((long)*pdVar7 + 0x24);
      uVar2 = CONCAT44(uVar3,*(undefined4 *)((long)*pdVar7 + 0x1c));
      uVar4 = CONCAT44(uVar5,*(undefined4 *)((long)*pdVar7 + 0x20));
      optInFastK_Period =
           TA_STOCH(in_ESI,iVar8,in_RCX,in_R8,in_R9,optInFastK_Period,unaff_R12D,TVar9,
                    (int)unaff_R15,(TA_MAType)unaff_RBP,(int *)unaff_retaddr,
                    (int *)in_stack_00000008,in_stack_00000010,
                    (double *)((ulong)in_stack_0000001c << 0x20));
    }
    else {
      iVar1 = *(int *)((long)*pdVar7 + 0x24);
      uVar2 = CONCAT44(uVar3,*(undefined4 *)((long)*pdVar7 + 0x1c));
      uVar4 = CONCAT44(uVar5,*(undefined4 *)((long)*pdVar7 + 0x20));
      optInFastK_Period =
           TA_STOCH(in_ESI,iVar8,in_RCX,in_R8,in_R9,optInFastK_Period,unaff_R12D,TVar9,
                    (int)unaff_R15,(TA_MAType)unaff_RBP,(int *)unaff_retaddr,
                    (int *)in_stack_00000008,in_stack_00000010,
                    (double *)CONCAT44(in_stack_0000001c,in_stack_00000018));
    }
    iVar1 = TA_STOCH_Lookback(iVar1,(int)((ulong)uVar4 >> 0x20),(TA_MAType)uVar4,
                              (int)((ulong)uVar2 >> 0x20),(TA_MAType)uVar2);
    *(int *)in_stack_00000008 = iVar1;
  }
  else if (iVar1 == 1) {
    if (in_stack_00000018 == 0) {
      optInFastD_MAType = *(TA_MAType *)((long)*pdVar7 + 0x18);
      iVar1 = *(int *)((long)*pdVar7 + 0x1c);
      optInFastK_Period =
           TA_STOCHF(in_ESI,iVar8,in_RCX,in_R8,in_R9,optInFastK_Period,unaff_R12D,TVar9,unaff_R15,
                     (int *)unaff_RBP,unaff_retaddr,in_stack_00000008);
    }
    else {
      optInFastD_MAType = *(TA_MAType *)((long)*pdVar7 + 0x18);
      iVar1 = *(int *)((long)*pdVar7 + 0x1c);
      optInFastK_Period =
           TA_STOCHF(in_ESI,iVar8,in_RCX,in_R8,in_R9,optInFastK_Period,unaff_R12D,TVar9,unaff_R15,
                     (int *)unaff_RBP,unaff_retaddr,in_stack_00000008);
    }
    iVar1 = TA_STOCHF_Lookback(iVar1,in_stack_ffffffffffffff4c,optInFastD_MAType);
    *(int *)in_stack_00000008 = iVar1;
  }
  else if (iVar1 == 2) {
    iVar1 = (int)((ulong)__ptr >> 0x20);
    iVar8 = (int)((ulong)pdVar7 >> 0x20);
    endIdx_00 = (int)((ulong)in_R9 >> 0x20);
    pvVar6 = __ptr;
    if (in_stack_00000018 == 0) {
      optInFastK_Period =
           TA_STOCHRSI((int)in_R8,endIdx_00,
                       (double *)CONCAT44(optInFastK_Period,in_stack_ffffffffffffffa8),iVar8,
                       (int)pdVar7,iVar1,unaff_R12D,unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr);
      TVar9 = (TA_MAType)((ulong)in_R8 >> 0x20);
      __ptr = in_RDX;
    }
    else {
      optInFastK_Period =
           TA_STOCHRSI((int)in_R8,endIdx_00,
                       (double *)CONCAT44(optInFastK_Period,in_stack_ffffffffffffffa8),iVar8,
                       (int)pdVar7,iVar1,unaff_R12D,unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr);
      TVar9 = (TA_MAType)((ulong)in_R8 >> 0x20);
    }
    iVar1 = TA_STOCHRSI_Lookback((int)__ptr,(int)((ulong)in_R9 >> 0x20),(int)in_R9,TVar9);
    *(int *)in_stack_00000008 = iVar1;
    __ptr = pvVar6;
  }
  free(__ptr);
  return optInFastK_Period;
}

Assistant:

static TA_RetCode rangeTestFunction( TA_Integer    startIdx,
                                     TA_Integer    endIdx,
                                     TA_Real      *outputBuffer,
                                     TA_Integer   *outputBufferInt,
                                     TA_Integer   *outBegIdx,
                                     TA_Integer   *outNbElement,
                                     TA_Integer   *lookback,
                                     void         *opaqueData,
                                     unsigned int  outputNb,
                                     unsigned int *isOutputInteger )
{
   TA_RetCode retCode;
   TA_RangeTestParam *testParam;

   (void)outputNb;
   (void)outputBufferInt;

   *isOutputInteger = 0;

   testParam = (TA_RangeTestParam *)opaqueData;

   retCode = TA_AVGDEV(
                        startIdx,
                        endIdx,
                        testParam->close,
                        testParam->test->optInTimePeriod,
                        outBegIdx,
                        outNbElement,
                        outputBuffer );


   *lookback = TA_AVGDEV_Lookback( testParam->test->optInTimePeriod );

   return retCode;
}